

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O1

int __thiscall
kj::_::BTreeImpl::verify
          (BTreeImpl *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  EVP_PKEY_CTX *pEVar1;
  Fault f_1;
  Fault local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  FunctionParam<bool_(unsigned_int,_unsigned_int)> local_18;
  
  local_18.space[0] = sig;
  local_18.space[1] = (void *)siglen;
  pEVar1 = (EVP_PKEY_CTX *)verifyNode(this,(size_t)ctx,&local_18,0,this->height,(MaybeUint)0x0);
  if (pEVar1 == ctx) {
    return (int)pEVar1;
  }
  local_30.exception = (Exception *)0x0;
  local_28 = 0;
  uStack_20 = 0;
  Debug::Fault::init(&local_30,
                     (EVP_PKEY_CTX *)
                     "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/table.c++"
                    );
  Debug::Fault::fatal(&local_30);
}

Assistant:

void BTreeImpl::verify(size_t size, FunctionParam<bool(uint, uint)> f) {
  KJ_ASSERT(verifyNode(size, f, 0, height, nullptr) == size);
}